

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

bool __thiscall
wasm::ValidationInfo::shouldBeUnequal<wasm::Name,wasm::Type>
          (ValidationInfo *this,Type left,Type right,Name curr,char *text,Function *func)

{
  Name curr_00;
  bool bVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  char *local_1d8;
  uintptr_t local_1c0;
  ostringstream local_1b8 [8];
  ostringstream ss;
  char *text_local;
  ValidationInfo *this_local;
  Name curr_local;
  Type right_local;
  Type left_local;
  
  curr_local.super_IString.str._M_len = curr.super_IString.str._M_str;
  curr_local.super_IString.str._M_str = (char *)right.id;
  right_local = left;
  bVar1 = wasm::Type::operator==(&right_local,(Type *)&curr_local.super_IString.str._M_str);
  if (bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1b8);
    local_1c0 = right_local.id;
    poVar2 = wasm::operator<<((ostream *)local_1b8,right_local);
    poVar2 = std::operator<<(poVar2," == ");
    local_1d8 = curr_local.super_IString.str._M_str;
    poVar2 = wasm::operator<<(poVar2,(Type)curr_local.super_IString.str._M_str);
    poVar2 = std::operator<<(poVar2,": ");
    std::operator<<(poVar2,text);
    std::__cxx11::ostringstream::str();
    curr_00.super_IString.str._M_str = (char *)curr_local.super_IString.str._M_len;
    curr_00.super_IString.str._M_len = curr.super_IString.str._M_len;
    fail<wasm::Name,std::__cxx11::string>(this,&local_1f8,curr_00,func);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  left_local.id._7_1_ = !bVar1;
  return left_local.id._7_1_;
}

Assistant:

bool shouldBeUnequal(
    S left, S right, T curr, const char* text, Function* func = nullptr) {
    if (left == right) {
      std::ostringstream ss;
      ss << left << " == " << right << ": " << text;
      fail(ss.str(), curr, func);
      return false;
    }
    return true;
  }